

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool insertToFiniteAutomation(adjacencyType *finiteAutomation,int start,int final,string *by)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  pointer pmVar4;
  pointer pcVar5;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar6;
  byte bVar7;
  iterator iVar8;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar9;
  initializer_list<int> __l;
  allocator_type local_aa;
  less<int> local_a9;
  int local_a8;
  int local_a4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
  local_a0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_50;
  
  local_a8 = final;
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::find(&(finiteAutomation->
                  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[start]._M_t,by);
  pmVar4 = (finiteAutomation->
           super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (iVar8._M_node == &pmVar4[start]._M_t._M_impl.super__Rb_tree_header._M_header) {
    local_a4 = local_a8;
    __l._M_len = 1;
    __l._M_array = &local_a4;
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_50,__l,&local_a9,&local_aa);
    paVar1 = &local_a0.first.field_2;
    pcVar5 = (by->_M_dataplus)._M_p;
    local_a0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar5,pcVar5 + by->_M_string_length);
    p_Var2 = &local_a0.second._M_t._M_impl.super__Rb_tree_header;
    if (local_50._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      psVar6 = &local_a0.second;
      local_a0.second._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_a0.second._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_a0.second._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_a0.second._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    }
    else {
      p_Var3 = &local_50._M_impl.super__Rb_tree_header;
      local_a0.second._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_50._M_impl.super__Rb_tree_header._M_header._M_color;
      local_a0.second._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_50._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_a0.second._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_50._M_impl.super__Rb_tree_header._M_header._M_left;
      local_a0.second._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_50._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_50._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
      psVar6 = (set<int,_std::less<int>,_std::allocator<int>_> *)&local_50._M_impl;
      local_a0.second._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_50._M_impl.super__Rb_tree_header._M_node_count;
      local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_50._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
      local_50._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    }
    *(size_t *)((long)&(psVar6->_M_t)._M_impl.super__Rb_tree_header + 0x20) = 0;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>>
    ::
    _M_emplace_unique<std::pair<std::__cxx11::string,std::set<int,std::less<int>,std::allocator<int>>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>>
                *)(pmVar4 + start),&local_a0);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_a0.second._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_50);
    bVar7 = 1;
  }
  else {
    pVar9 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       (iVar8._M_node + 2),&local_a8);
    bVar7 = pVar9.second;
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool insertToFiniteAutomation(adjacencyType & finiteAutomation, int start, int final, string & by) {
    auto existIter = finiteAutomation[start].find(by);
    if (existIter != finiteAutomation[start].end()) {
        return existIter->second.insert(final).second;
    }
    finiteAutomation[start].insert(make_pair(by, set<int>{final}));
    return true;
}